

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

void Abc_SuppVerify(Vec_Wrd_t *p,word *pMatrix,int nVars,int nVarsMin)

{
  word *pwVar1;
  Vec_Wrd_t *p_00;
  word *pwVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  word *pwVar6;
  word *pwVar7;
  long lVar8;
  int iVar9;
  word Entry;
  word *pwVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  bool bVar14;
  
  iVar9 = p->nSize;
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar4 = iVar9;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    pwVar2 = (word *)0x0;
  }
  else {
    pwVar2 = (word *)malloc((long)iVar4 << 3);
  }
  p_00->pArray = pwVar2;
  if (0 < p->nSize) {
    lVar8 = 0;
    do {
      if (nVarsMin < 1) {
        Entry = 0;
      }
      else {
        uVar3 = 0;
        Entry = 0;
        do {
          if (nVars < 1) {
            bVar14 = true;
          }
          else {
            uVar5 = 0;
            bVar14 = false;
            do {
              bVar11 = bVar14;
              uVar13 = 1L << ((byte)uVar5 & 0x3f);
              bVar12 = (uVar13 & p->pArray[lVar8]) != 0 && (pMatrix[uVar3] & uVar13) != 0;
              uVar5 = uVar5 + 1;
              bVar14 = (bool)(bVar11 ^ bVar12);
            } while ((uint)nVars != uVar5);
            bVar14 = bVar11 == bVar12;
          }
          uVar5 = 0;
          if (!bVar14) {
            uVar5 = 1L << ((byte)uVar3 & 0x3f);
          }
          Entry = Entry | uVar5;
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)nVarsMin);
      }
      Vec_WrdPush(p_00,Entry);
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nSize);
  }
  pwVar2 = p_00->pArray;
  if ((long)p_00->nSize < 1) {
    iVar9 = 0;
  }
  else {
    pwVar1 = pwVar2 + p_00->nSize;
    iVar9 = 0;
    pwVar6 = pwVar2;
    do {
      pwVar7 = pwVar6 + 1;
      if (pwVar7 < pwVar1) {
        pwVar10 = pwVar7;
        do {
          iVar9 = iVar9 + (uint)(*pwVar6 == *pwVar10);
          pwVar10 = pwVar10 + 1;
        } while (pwVar10 < pwVar1);
      }
      pwVar6 = pwVar7;
    } while (pwVar7 < pwVar1);
  }
  if (iVar9 == 0) {
    puts("Verification successful.");
  }
  else {
    printf("The total of %d pairs fail verification.\n");
  }
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
    p_00->pArray = (word *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Abc_SuppVerify( Vec_Wrd_t * p, word * pMatrix, int nVars, int nVarsMin )
{
    Vec_Wrd_t * pNew;
    word * pLimit, * pEntry1, * pEntry2;
    word Entry, EntryNew;
    int i, k, v, Value, Counter = 0;
    pNew = Vec_WrdAlloc( Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        EntryNew = 0;
        for ( v = 0; v < nVarsMin; v++ )
        {
            Value = 0;
            for ( k = 0; k < nVars; k++ )
                if ( ((pMatrix[v] >> k) & 1) && ((Entry >> k) & 1) )
                    Value ^= 1;
            if ( Value )
                EntryNew |= (((word)1) << v);            
        }
        Vec_WrdPush( pNew, EntryNew );
    }
    // check that they are disjoint
    pLimit  = Vec_WrdLimit(pNew);
    pEntry1 = Vec_WrdArray(pNew);
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
        if ( *pEntry1 == *pEntry2 )
            Counter++;
    if ( Counter )
        printf( "The total of %d pairs fail verification.\n", Counter );
    else
        printf( "Verification successful.\n" );
    Vec_WrdFree( pNew );
}